

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueKmerIndex.cc
# Opt level: O1

void __thiscall
Unique63merIndex::Unique63merIndex(Unique63merIndex *this,SequenceDistanceGraph *sg,uint8_t _k)

{
  uint32_t uVar1;
  ulong uVar2;
  sgNodeID_t sVar3;
  value_type_conflict2 vVar4;
  uint uVar5;
  Support *pSVar6;
  undefined8 uVar7;
  pointer ppVar8;
  graphStrandPos *pgVar9;
  mapped_type *pmVar10;
  pointer puVar11;
  graphStrandPos *pgVar12;
  pointer ppVar13;
  pointer ppVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  graphStrandPos *pgVar18;
  pointer pNVar19;
  ulong uVar20;
  pointer ppVar21;
  ulong uVar22;
  size_type __n;
  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
  __i;
  pointer ppVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  __hashtable *__this;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  kidxv;
  FastaRecord r;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen_contigs;
  kmerPosFactory128 kcf;
  allocator_type local_3a9;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  local_3a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_390;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_388;
  value_type_conflict2 local_380;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_378;
  value_type_conflict2 local_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348;
  undefined7 uStack_347;
  undefined1 *local_338;
  undefined8 local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_318;
  undefined1 local_2d8 [16];
  pointer puStack_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  ulong local_2a0;
  long local_298;
  long local_290;
  char local_288 [65];
  char local_247;
  char local_245;
  char local_241;
  char local_234;
  char local_227;
  char local_225;
  char local_221;
  char local_214;
  undefined1 local_188 [65];
  char local_147;
  char local_145;
  char local_141;
  char local_134;
  char local_127;
  char local_125;
  char local_121;
  char local_114;
  int32_t local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  (this->kmer_to_graphposition)._M_h._M_buckets =
       &(this->kmer_to_graphposition)._M_h._M_single_bucket;
  (this->kmer_to_graphposition)._M_h._M_bucket_count = 1;
  (this->kmer_to_graphposition)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->kmer_to_graphposition)._M_h._M_element_count = 0;
  (this->kmer_to_graphposition)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->kmer_to_graphposition)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->kmer_to_graphposition)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->k = _k;
  local_390 = &this->unique_kmers_per_node;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)this);
  local_3a8.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360 = 0;
  local_388 = &this->total_kmers_per_node;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,
             ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_360,
             (allocator_type *)&local_318);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->total_kmers_per_node,local_2d8);
  if ((pointer *)local_2d8._0_8_ != (pointer *)0x0) {
    operator_delete((void *)local_2d8._0_8_,(long)puStack_2c8 - local_2d8._0_8_);
  }
  pNVar19 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish == pNVar19) {
    __n = 0;
  }
  else {
    lVar17 = 0;
    __n = 0;
    uVar15 = 0;
    do {
      lVar16 = *(long *)((long)&(pNVar19->sequence)._M_dataplus._M_p + lVar17);
      local_2d8._0_8_ = &puStack_2c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2d8,lVar16,
                 *(long *)((long)&(pNVar19->sequence)._M_string_length + lVar17) + lVar16);
      local_2a8 = *(undefined8 *)((long)&(pNVar19->support).id + lVar17);
      local_2b8 = *(undefined8 *)(&pNVar19->status + lVar17);
      pSVar6 = (Support *)(&pNVar19->status + lVar17 + 8);
      uStack_2b0._0_1_ = pSVar6->type;
      uStack_2b0._1_1_ = pSVar6->field_0x1;
      uStack_2b0._2_2_ = pSVar6->index;
      uStack_2b0._4_4_ = *(undefined4 *)&pSVar6->field_0x4;
      puVar11 = (pointer)(ulong)this->k;
      if (puVar11 <= (ulong)local_2d8._8_8_) {
        __n = local_2d8._8_8_ + (__n - (long)puVar11) + 1;
        (local_388->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar15] = local_2d8._8_8_ + (1 - (long)puVar11);
      }
      if ((pointer *)local_2d8._0_8_ != &puStack_2c8) {
        operator_delete((void *)local_2d8._0_8_,(long)puStack_2c8 + 1);
      }
      uVar15 = uVar15 + 1;
      pNVar19 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x38;
    } while (uVar15 < (ulong)(((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pNVar19 >> 3)
                             * 0x6db6db6db6db6db7));
  }
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::reserve(&local_3a8,__n);
  local_358 = &local_348;
  local_350 = 0;
  local_348 = 0;
  local_338 = &local_328;
  local_330 = 0;
  local_328 = 0;
  local_2d8[0] = this->k;
  uVar5 = (uint)this->k * 2;
  uVar15 = -1L << ((byte)uVar5 & 0x3f);
  local_2a8 = uVar15;
  local_2a0 = 0xffffffffffffffff;
  if ((uVar5 & 0x40) != 0) {
    local_2a8 = 0;
    local_2a0 = uVar15;
  }
  local_2a8 = ~local_2a8;
  local_2a0 = ~local_2a0;
  local_2d8._8_8_ = (pointer)0x0;
  puStack_2c8 = (pointer)0x0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_298 = (ulong)uVar5 - 2;
  local_290 = (ulong)(1 < (ulong)uVar5) - 1;
  memset(local_288,0,0x100);
  local_288[0] = '\x04';
  memset(local_188,0,0x100);
  memset(local_288,4,0xff);
  memset(local_188,4,0xff);
  local_247 = '\0';
  local_227 = '\0';
  local_245 = '\x01';
  local_225 = '\x01';
  local_241 = '\x02';
  local_221 = '\x02';
  local_234 = '\x03';
  local_214 = '\x03';
  local_147 = '\x03';
  local_127 = '\x03';
  local_145 = '\x02';
  local_125 = '\x02';
  local_141 = '\x01';
  local_121 = '\x01';
  local_134 = '\0';
  local_114 = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)local_50;
  local_58 = 0;
  local_50[0]._M_local_buf[0] = '\0';
  pNVar19 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar19 >> 3) *
                 0x6db6db6db6db6db7)) {
    uVar15 = 1;
    lVar17 = 0x38;
    do {
      if ((ulong)this->k <= *(ulong *)((long)&(pNVar19->sequence)._M_string_length + lVar17)) {
        local_360 = CONCAT44(local_360._4_4_,(int)uVar15);
        std::__cxx11::string::_M_assign((string *)&local_338);
        local_88 = (int32_t)local_360;
        std::__cxx11::string::_M_assign((string *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_60);
        uStack_2c0 = 0;
        local_2b8 = 0;
        local_2d8._8_8_ = (pointer)0x0;
        puStack_2c8 = (pointer)0x0;
        uStack_2b0 = 0;
        kmerPosFactory128::next_element((kmerPosFactory128 *)local_2d8,&local_3a8);
      }
      uVar15 = uVar15 + 1;
      pNVar19 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x38;
    } while (uVar15 < (ulong)(((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pNVar19 >> 3)
                             * 0x6db6db6db6db6db7));
  }
  ppVar8 = local_3a8.
           super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar13 = local_3a8.
            super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar14 = local_3a8.
            super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar21 = local_3a8.
            super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_3a8.
      super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3a8.
      super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar16 = (long)local_3a8.
                   super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_3a8.
                   super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar15 = lVar16 >> 5;
    lVar17 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
              (local_3a8.
               super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_3a8.
               super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar16 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
                (ppVar13,ppVar8);
      ppVar14 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar21 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      ppVar23 = ppVar13 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
                (ppVar13,ppVar23);
      ppVar14 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar21 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar23 != ppVar8) {
        pgVar18 = &ppVar13[0x10].second;
        do {
          uVar15 = (ulong)ppVar23->first;
          uVar2 = *(ulong *)((long)&ppVar23->first + 8);
          uVar1 = (ppVar23->second).pos;
          local_318._M_bucket_count = CONCAT44(local_318._M_bucket_count._4_4_,uVar1);
          local_318._M_buckets = (__buckets_ptr)(ppVar23->second).node;
          uVar20 = *(ulong *)((long)&ppVar23[-1].first + 8);
          uVar22 = (ulong)ppVar23[-1].first;
          ppVar13 = ppVar23;
          pgVar9 = pgVar18;
          if (uVar2 < uVar20 || uVar2 - uVar20 < (ulong)(uVar15 < uVar22)) {
            do {
              pgVar12 = pgVar9;
              *(ulong *)&((pair<unsigned___int128,_graphStrandPos> *)(pgVar12 + -1))->first = uVar22
              ;
              *(ulong *)((long)&((pair<unsigned___int128,_graphStrandPos> *)(pgVar12 + -1))->first +
                        8) = uVar20;
              pgVar12->node = pgVar12[-2].node;
              pgVar12->pos = *(uint32_t *)((long)(pgVar12 + -2) + 8);
              uVar22 = *(ulong *)(pgVar12 + -5);
              uVar20 = *(ulong *)((long)(pgVar12 + -5) + 8);
              pgVar9 = pgVar12 + -2;
            } while (uVar2 < uVar20 || uVar2 - uVar20 < (ulong)(uVar15 < uVar22));
            ppVar13 = (pointer)(pgVar12 + -3);
          }
          *(ulong *)&ppVar13->first = uVar15;
          *(ulong *)((long)&ppVar13->first + 8) = uVar2;
          (ppVar13->second).node = (sgNodeID_t)local_318._M_buckets;
          (ppVar13->second).pos = uVar1;
          ppVar23 = ppVar23 + 1;
          pgVar18 = pgVar18 + 2;
        } while (ppVar23 != ppVar8);
      }
    }
  }
  do {
    ppVar13 = ppVar14;
    if (local_3a8.
        super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
        ._M_impl.super__Vector_impl_data._M_finish <= ppVar13) {
      std::
      vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ::resize(&local_3a8,
               (long)ppVar21 -
               (long)local_3a8.
                     super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_318._M_buckets = &local_318._M_single_bucket;
      local_318._M_bucket_count = 1;
      local_318._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_318._M_element_count = 0;
      local_318._M_rehash_policy._M_max_load_factor = 1.0;
      local_318._M_rehash_policy._M_next_resize = 0;
      local_318._M_single_bucket = (__node_base_ptr)0x0;
      lVar17 = ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      auVar24._8_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar24._0_8_ = lVar17;
      auVar24._12_4_ = 0x45300000;
      dVar25 = (auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
      uVar15 = (ulong)dVar25;
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::rehash(&local_318,(long)(dVar25 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15);
      local_380 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_378,
                 ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_380,
                 &local_3a9);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (local_390,&local_378);
      if ((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_378.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
          (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)0x0) {
        operator_delete(local_378.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_378.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_378.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar17 = (long)local_3a8.
                     super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3a8.
                     super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      auVar26._8_4_ =
           (int)((long)local_3a8.
                       super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_3a8.
                       super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 0x25);
      auVar26._0_8_ = lVar17;
      auVar26._12_4_ = 0x45300000;
      dVar25 = ceil(((auVar26._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) /
                    (double)(this->kmer_to_graphposition)._M_h._M_rehash_policy._M_max_load_factor);
      std::
      _Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::rehash((_Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this,(long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25)
      ;
      ppVar21 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_3a8.
          super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_3a8.
          super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar13 = local_3a8.
                  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          sVar3 = (ppVar13->second).node;
          uVar1 = (ppVar13->second).pos;
          pmVar10 = std::__detail::
                    _Map_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this,&ppVar13->first);
          pmVar10->node = sVar3;
          pmVar10->pos = uVar1;
          lVar17 = (ppVar13->second).node;
          lVar16 = -lVar17;
          if (0 < lVar17) {
            lVar16 = lVar17;
          }
          puVar11 = (local_390->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar16;
          *puVar11 = *puVar11 + 1;
          vVar4 = (ppVar13->second).node;
          local_380 = -vVar4;
          if (0 < (long)vVar4) {
            local_380 = vVar4;
          }
          local_378.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_318;
          std::
          _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                    ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_378.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,&local_380,&local_378);
          ppVar13 = ppVar13 + 1;
        } while (ppVar13 != ppVar21);
      }
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_318);
      kmerPosFactory128::~kmerPosFactory128((kmerPosFactory128 *)local_2d8);
      if (local_338 != &local_328) {
        operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,CONCAT71(uStack_347,local_348) + 1);
      }
      if (local_3a8.
          super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3a8.
                        super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3a8.
                              super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3a8.
                              super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    ppVar14 = ppVar13;
    do {
      if (*(long *)((long)&ppVar14->first + 8) != *(long *)((long)&ppVar13->first + 8) ||
          (long)ppVar14->first != (long)ppVar13->first) break;
      ppVar14 = ppVar14 + 1;
    } while (ppVar14 !=
             local_3a8.
             super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if ((long)ppVar14 - (long)ppVar13 == 0x20) {
      uVar7 = *(undefined8 *)((long)&ppVar13->first + 8);
      *(long *)&ppVar21->first = (long)ppVar13->first;
      *(undefined8 *)((long)&ppVar21->first + 8) = uVar7;
      (ppVar21->second).node = (ppVar13->second).node;
      (ppVar21->second).pos = (ppVar13->second).pos;
      ppVar21 = ppVar21 + 1;
    }
  } while( true );
}

Assistant:

Unique63merIndex::Unique63merIndex(const SequenceDistanceGraph &sg, const uint8_t _k) : k(_k){
    kmer_to_graphposition.clear();
    std::vector<pair> kidxv;
    uint64_t total_k { 0 };
    total_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    for (sgNodeID_t node = 0; node < sg.nodes.size(); node++) {
        auto sgnode = sg.nodes[node];
        if (sgnode.sequence.size() >= k) {
            auto n = sgnode.sequence.size() + 1 - k;
            total_k += n;
            total_kmers_per_node[node] = n;
        }
    }
    kidxv.reserve(total_k);
    FastaRecord r;
    kmerPosFactory128 kcf({k});
    for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
        if (sg.nodes[n].sequence.size() >= k) {
            r.id = n;
            r.seq = sg.nodes[n].sequence;
            kcf.setFileRecord(r);
            kcf.next_element(kidxv);
        }
    }

    sdglib::sort(kidxv.begin(),kidxv.end(),[](const pair & a, const pair & b){return a.first<b.first;});

    auto wi=kidxv.begin();
    auto ri=kidxv.begin();
    auto nri=kidxv.begin();
    while (ri<kidxv.end()){
        while (nri!=kidxv.end() and nri->first==ri->first) ++nri;
        if (nri-ri==1) {
            *wi=*ri;
            ++wi;
        }
        ri=nri;
    }
    kidxv.resize(wi - kidxv.begin());

    std::unordered_set<sgNodeID_t > seen_contigs;
    seen_contigs.reserve(sg.nodes.size());
    unique_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    kmer_to_graphposition.reserve(kidxv.size());
    for (auto &kidx :kidxv) {
        kmer_to_graphposition[kidx.first] = { kidx.second.node, kidx.second.pos };
        unique_kmers_per_node[std::abs(kidx.second.node)] += 1;
        seen_contigs.insert(std::abs(kidx.second.node));
    }
}